

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O0

void cuddSlowTableGrowth(DdManager *unique)

{
  int local_14;
  int i;
  DdManager *unique_local;
  
  unique->maxCacheHard = unique->cacheSlots - 1;
  unique->cacheSlack = -(unique->cacheSlots + 1);
  for (local_14 = 0; local_14 < unique->size; local_14 = local_14 + 1) {
    unique->subtables[local_14].maxKeys = unique->subtables[local_14].maxKeys << 2;
  }
  unique->gcFrac = 0.2;
  unique->minDead = (uint)(long)((double)unique->slots * 0.2);
  cuddShrinkDeathRow(unique);
  fprintf((FILE *)unique->err,"Slowing down table growth: ");
  fprintf((FILE *)unique->err,"GC fraction = %.2f\t",unique->gcFrac);
  fprintf((FILE *)unique->err,"minDead = %u\n",(ulong)unique->minDead);
  return;
}

Assistant:

void
cuddSlowTableGrowth(
  DdManager *unique)
{
    int i;

    unique->maxCacheHard = unique->cacheSlots - 1;
    unique->cacheSlack = - (int) (unique->cacheSlots + 1);
    for (i = 0; i < unique->size; i++) {
        unique->subtables[i].maxKeys <<= 2;
    }
    unique->gcFrac = DD_GC_FRAC_MIN;
    unique->minDead = (unsigned) (DD_GC_FRAC_MIN * (double) unique->slots);
    cuddShrinkDeathRow(unique);
    (void) fprintf(unique->err,"Slowing down table growth: ");
    (void) fprintf(unique->err,"GC fraction = %.2f\t", unique->gcFrac);
    (void) fprintf(unique->err,"minDead = %u\n", unique->minDead);

}